

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

SquareMatrix<double> __thiscall qclab::qgates::RotationY<double>::matrix(RotationY<double> *this)

{
  data_type extraout_RDX;
  QRotationGate1<double> *in_RSI;
  double in_XMM0_Qa;
  double __x;
  double dVar1;
  double __x_00;
  double m11;
  SquareMatrix<double> SVar2;
  RotationY<double> *this_local;
  
  __x = QRotationGate1<double>::cos(in_RSI,in_XMM0_Qa);
  dVar1 = QRotationGate1<double>::sin(in_RSI,__x);
  __x_00 = QRotationGate1<double>::sin(in_RSI,-dVar1);
  m11 = QRotationGate1<double>::cos(in_RSI,__x_00);
  dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,__x,-dVar1,__x_00,m11);
  SVar2.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( this->cos() , -this->sin() ,
                                                  this->sin() ,  this->cos() ) ;
        }